

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

char * absl::status_internal::MakeCheckFailString(Status *status,char *prefix)

{
  string *__return_storage_ptr__;
  char *pcVar1;
  AlphaNum *in_R9;
  AlphaNum local_108;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_48;
  char *local_18;
  char *prefix_local;
  Status *status_local;
  
  local_18 = prefix;
  prefix_local = (char *)status;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  AlphaNum::AlphaNum(&local_48,local_18);
  AlphaNum::AlphaNum(&local_88," (");
  Status::ToString_abi_cxx11_(&local_d8,(Status *)prefix_local,kWithEverything);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,&local_d8);
  AlphaNum::AlphaNum(&local_108,")");
  StrCat_abi_cxx11_(__return_storage_ptr__,(absl *)&local_48,&local_88,&local_b8,&local_108,in_R9);
  IgnoreLeak<std::__cxx11::string>(__return_storage_ptr__);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)&local_d8);
  return pcVar1;
}

Assistant:

const char* absl_nonnull MakeCheckFailString(
    const absl::Status* absl_nonnull status, const char* absl_nonnull prefix) {
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(
             new std::string(absl::StrCat(
                 prefix, " (",
                 status->ToString(StatusToStringMode::kWithEverything), ")")))
      ->c_str();
}